

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_distances.cc
# Opt level: O0

S2Point * S2::Interpolate(S2Point *__return_storage_ptr__,double t,S2Point *a,S2Point *b)

{
  S1Angle ax_angle;
  S1Angle local_28;
  S1Angle ab;
  S2Point *b_local;
  S2Point *a_local;
  double t_local;
  
  if ((t != 0.0) || (NAN(t))) {
    if ((t != 1.0) || (NAN(t))) {
      ab.radians_ = (double)b;
      S1Angle::S1Angle(&local_28,a,b);
      ax_angle = ::operator*(t,local_28);
      InterpolateAtDistance(__return_storage_ptr__,ax_angle,a,(S2Point *)ab.radians_);
    }
    else {
      __return_storage_ptr__->c_[0] = b->c_[0];
      __return_storage_ptr__->c_[1] = b->c_[1];
      __return_storage_ptr__->c_[2] = b->c_[2];
    }
  }
  else {
    __return_storage_ptr__->c_[0] = a->c_[0];
    __return_storage_ptr__->c_[1] = a->c_[1];
    __return_storage_ptr__->c_[2] = a->c_[2];
  }
  return __return_storage_ptr__;
}

Assistant:

S2Point Interpolate(double t, const S2Point& a, const S2Point& b) {
  if (t == 0) return a;
  if (t == 1) return b;
  S1Angle ab(a, b);
  return InterpolateAtDistance(t * ab, a, b);
}